

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O0

void ge_p3_tobytes(uchar *s,ge_p3 *h)

{
  int iVar1;
  i32 local_a8 [2];
  fe y;
  i32 local_78 [2];
  fe x;
  i32 local_48 [2];
  fe recip;
  ge_p3 *h_local;
  uchar *s_local;
  
  fe_invert(local_48,h->Z);
  fe_mul(local_78,h->X,local_48);
  fe_mul(local_a8,h->Y,local_48);
  fe_tobytes(s,local_a8);
  iVar1 = fe_isnegative(local_78);
  s[0x1f] = s[0x1f] ^ (byte)(iVar1 << 7);
  return;
}

Assistant:

void ge_p3_tobytes(unsigned char *s, const ge_p3 *h) {
    fe recip;
    fe x;
    fe y;
    fe_invert(recip, h->Z);
    fe_mul(x, h->X, recip);
    fe_mul(y, h->Y, recip);
    fe_tobytes(s, y);
    s[31] ^= fe_isnegative(x) << 7;
}